

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

bool __thiscall cmCTestGIT::LoadModifications(cmCTestGIT *this)

{
  pointer pcVar1;
  pointer pCVar2;
  char *git_update_index [4];
  char *git_diff_index [6];
  OutputLogger err;
  OutputLogger ui_err;
  OutputLogger ui_out;
  DiffParser out;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  git_update_index[1] = "update-index";
  git_update_index[2] = "--refresh";
  git_update_index[3] = (char *)0x0;
  git_update_index[0] = pcVar1;
  cmProcessTools::OutputLogger::OutputLogger
            (&ui_out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&ui_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"ui-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,git_update_index,(OutputParser *)&ui_out,
                      (OutputParser *)&ui_err,(char *)0x0,UTF8);
  git_diff_index[1] = "diff-index";
  git_diff_index[2] = "-z";
  git_diff_index[3] = "HEAD";
  git_diff_index[4] = "--";
  git_diff_index[5] = (char *)0x0;
  git_diff_index[0] = pcVar1;
  DiffParser::DiffParser(&out,this,"di-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"di-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,git_diff_index,(OutputParser *)&out,(OutputParser *)&err,
                      (char *)0x0,UTF8);
  for (pCVar2 = out.Changes.
                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 != out.Changes.
                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
    (*(this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])(this,1,&pCVar2->Path);
  }
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  DiffParser::~DiffParser(&out);
  cmProcessTools::LineParser::~LineParser(&ui_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&ui_out.super_LineParser);
  return true;
}

Assistant:

bool cmCTestGIT::LoadModifications()
{
  const char* git = this->CommandLineTool.c_str();

  // Use 'git update-index' to refresh the index w.r.t. the work tree.
  const char* git_update_index[] = { git, "update-index", "--refresh",
                                     nullptr };
  OutputLogger ui_out(this->Log, "ui-out> ");
  OutputLogger ui_err(this->Log, "ui-err> ");
  this->RunChild(git_update_index, &ui_out, &ui_err, nullptr,
                 cmProcessOutput::UTF8);

  // Use 'git diff-index' to get modified files.
  const char* git_diff_index[] = { git,    "diff-index", "-z",
                                   "HEAD", "--",         nullptr };
  DiffParser out(this, "di-out> ");
  OutputLogger err(this->Log, "di-err> ");
  this->RunChild(git_diff_index, &out, &err, nullptr, cmProcessOutput::UTF8);

  for (Change const& c : out.Changes) {
    this->DoModification(PathModified, c.Path);
  }
  return true;
}